

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiTextBuffer::append(ImGuiTextBuffer *this,char *str,char *str_end)

{
  int iVar1;
  size_t sVar2;
  int new_size;
  int iVar3;
  int iVar4;
  
  if (str_end == (char *)0x0) {
    sVar2 = strlen(str);
    iVar4 = (int)sVar2;
  }
  else {
    iVar4 = (int)str_end - (int)str;
  }
  iVar3 = (this->Buf).Size;
  iVar1 = (this->Buf).Capacity;
  iVar3 = iVar3 + (uint)(iVar3 == 0);
  new_size = iVar3 + iVar4;
  if (iVar1 <= new_size) {
    iVar1 = iVar1 * 2;
    if (iVar1 < new_size) {
      iVar1 = new_size;
    }
    ImVector<char>::reserve(&this->Buf,iVar1);
  }
  ImVector<char>::resize(&this->Buf,new_size);
  memcpy((this->Buf).Data + (long)iVar3 + -1,str,(long)iVar4);
  (this->Buf).Data[iVar3 + iVar4 + -1] = '\0';
  return;
}

Assistant:

void ImGuiTextBuffer::append(const char* str, const char* str_end)
{
    int len = str_end ? (int)(str_end - str) : (int)strlen(str);

    // Add zero-terminator the first time
    const int write_off = (Buf.Size != 0) ? Buf.Size : 1;
    const int needed_sz = write_off + len;
    if (write_off + len >= Buf.Capacity)
    {
        int new_capacity = Buf.Capacity * 2;
        Buf.reserve(needed_sz > new_capacity ? needed_sz : new_capacity);
    }

    Buf.resize(needed_sz);
    memcpy(&Buf[write_off - 1], str, (size_t)len);
    Buf[write_off - 1 + len] = 0;
}